

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool flatbuffers::DeserializeAttributesCommon
               (SymbolTable<flatbuffers::Value> *attributes,Parser *parser,
               Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs)

{
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *pVVar4;
  bool bVar5;
  ushort uVar6;
  _Alloc_hider e;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  bool local_81;
  string local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *local_60;
  string *local_58;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *local_50;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *local_48;
  SymbolTable<flatbuffers::Value> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  if (attrs == (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0) {
    local_81 = true;
  }
  else {
    local_81 = *(int *)attrs == 0;
    if (!local_81) {
      local_48 = attrs + 4;
      local_60 = &parser->known_attributes_;
      uVar10 = 0;
      uVar8 = 0;
      local_50 = attrs;
      local_40 = attributes;
      do {
        pVVar4 = local_48;
        uVar3 = *(uint *)(local_48 + uVar10);
        pVVar1 = local_48 + (ulong)uVar3 + (ulong)uVar10;
        e._M_p = (pointer)operator_new(0x48);
        local_58 = (string *)&((Value *)e._M_p)->constant;
        local_38 = &(((Value *)e._M_p)->constant).field_2;
        (((Value *)e._M_p)->type).base_type = BASE_TYPE_NONE;
        (((Value *)e._M_p)->type).element = BASE_TYPE_NONE;
        (((Value *)e._M_p)->type).struct_def = (StructDef *)0x0;
        *(undefined8 *)((long)&(((Value *)e._M_p)->type).struct_def + 2) = 0;
        *(undefined8 *)((long)&(((Value *)e._M_p)->type).enum_def + 2) = 0;
        (((Value *)e._M_p)->constant)._M_dataplus._M_p = (pointer)local_38;
        *(undefined2 *)&(((Value *)e._M_p)->constant).field_2 = 0x30;
        (((Value *)e._M_p)->constant)._M_string_length = 1;
        ((Value *)e._M_p)->offset = 0xffff;
        if ((6 < *(ushort *)(pVVar1 + -(long)*(int *)(pVVar4 + (ulong)uVar3 + (ulong)uVar10))) &&
           (lVar7 = -(long)*(int *)(pVVar4 + (ulong)uVar3 + (ulong)uVar10),
           *(short *)(pVVar1 + lVar7 + 6) != 0)) {
          if (*(ushort *)(pVVar1 + -(long)*(int *)(pVVar4 + (ulong)uVar3 + (ulong)uVar10)) < 7) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)(pVVar1 + lVar7 + 6);
          }
          uVar9 = (ulong)uVar6;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pVVar1 + (ulong)*(uint *)(pVVar1 + uVar9) + 4 + uVar9,
                     pVVar1 + (ulong)*(uint *)(pVVar1 + (ulong)*(uint *)(pVVar1 + uVar9) + 4 + uVar9
                                              + -4) + *(uint *)(pVVar1 + uVar9) + uVar9 + 4);
          std::__cxx11::string::operator=(local_58,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        if (*(ushort *)(pVVar1 + -(long)*(int *)pVVar1) < 5) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(ushort *)(pVVar1 + (4 - (long)*(int *)pVVar1));
        }
        paVar2 = &local_80.field_2;
        uVar9 = (ulong)uVar6;
        local_80._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,pVVar1 + (ulong)*(uint *)(pVVar1 + uVar9) + 4 + uVar9,
                   pVVar1 + (ulong)*(uint *)(pVVar1 + (ulong)*(uint *)(pVVar1 + uVar9) + 4 + uVar9 +
                                            -4) + *(uint *)(pVVar1 + uVar9) + uVar9 + 4);
        bVar5 = SymbolTable<flatbuffers::Value>::Add(local_40,&local_80,(Value *)e._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (bVar5) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(long **)local_58 != local_38) {
            operator_delete(*(long **)local_58,local_38->_M_allocated_capacity + 1);
          }
          uVar9 = 0x48;
LAB_00122689:
          operator_delete(e._M_p,uVar9);
        }
        else {
          if (*(ushort *)(pVVar1 + -(long)*(int *)pVVar1) < 5) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(ushort *)(pVVar1 + (4 - (long)*(int *)pVVar1));
          }
          uVar9 = (ulong)uVar6;
          local_80._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pVVar1 + *(uint *)(pVVar1 + uVar9) + uVar9 + 4,
                     pVVar1 + (ulong)*(uint *)(pVVar1 + *(uint *)(pVVar1 + uVar9) + uVar9) +
                              *(uint *)(pVVar1 + uVar9) + uVar9 + 4);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::operator[](local_60,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != paVar2) {
            uVar9 = local_80.field_2._M_allocated_capacity + 1;
            e._M_p = local_80._M_dataplus._M_p;
            goto LAB_00122689;
          }
        }
        if (bVar5) {
          return local_81;
        }
        uVar8 = uVar8 + 1;
        uVar10 = uVar10 + 4;
        local_81 = uVar8 >= *(uint *)local_50;
      } while (uVar8 < *(uint *)local_50);
    }
  }
  return local_81;
}

Assistant:

static bool DeserializeAttributesCommon(
    SymbolTable<Value> &attributes, Parser &parser,
    const Vector<Offset<reflection::KeyValue>> *attrs) {
  if (attrs == nullptr) return true;
  for (uoffset_t i = 0; i < attrs->size(); ++i) {
    auto kv = attrs->Get(i);
    auto value = new Value();
    if (kv->value()) { value->constant = kv->value()->str(); }
    if (attributes.Add(kv->key()->str(), value)) {
      delete value;
      return false;
    }
    parser.known_attributes_[kv->key()->str()];
  }
  return true;
}